

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O2

int nni_id_remove(nni_id_map *m,uint64_t id)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  uint32_t uVar4;
  nni_id_entry *pnVar5;
  uint uVar6;
  
  sVar3 = id_find(m,id);
  if (sVar3 == 0xffffffffffffffff) {
    iVar2 = 0xc;
  }
  else {
    uVar1 = m->id_cap;
    uVar6 = (uint)id & uVar1 - 1;
    while( true ) {
      m->id_load = m->id_load - 1;
      pnVar5 = m->id_entries + uVar6;
      if (uVar6 == sVar3) break;
      uVar4 = pnVar5->skips;
      if (uVar4 == 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                  ,0x107,"entry->skips > 0");
        uVar4 = pnVar5->skips;
        uVar1 = m->id_cap;
      }
      pnVar5->skips = uVar4 - 1;
      uVar6 = uVar1 - 1 & uVar6 * 5 + 1;
    }
    pnVar5->val = (void *)0x0;
    pnVar5->key = 0;
    m->id_count = m->id_count - 1;
    id_resize(m);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nni_id_remove(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t probe;

	if ((index = id_find(m, id)) == (size_t) -1) {
		return (NNG_ENOENT);
	}

	// Now we have found the index where the object exists.  We are going
	// to restart the search, until the index matches, to decrement the
	// skips counter.
	probe = ID_INDEX(m, id);

	for (;;) {
		nni_id_entry *entry;

		// The load was increased once each hashing operation we used
		// to place the item.  Decrement it accordingly.
		m->id_load--;
		entry = &m->id_entries[probe];
		if (probe == index) {
			entry->val = NULL;
			entry->key = 0; // invalid key
			break;
		}
		NNI_ASSERT(entry->skips > 0);
		entry->skips--;
		probe = ID_NEXT(m, probe);
	}

	m->id_count--;

	// Shrink -- but it's ok if we can't.
	(void) id_resize(m);

	return (0);
}